

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void __thiscall
duckdb::BitpackingCompressionState<unsigned_char,_true,_signed_char>::Append
          (BitpackingCompressionState<unsigned_char,_true,_signed_char> *this,
          UnifiedVectorFormat *vdata,idx_t count)

{
  ulong in_RDX;
  UnifiedVectorFormat *in_RSI;
  BitpackingState<unsigned_char,_signed_char> *in_RDI;
  idx_t idx;
  idx_t i;
  uchar *data;
  idx_t row_idx;
  idx_t local_28;
  
  UnifiedVectorFormat::GetData<unsigned_char>(in_RSI);
  for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 1) {
    SelectionVector::get_index(in_RSI->sel,local_28);
    row_idx = (long)in_RDI->compression_buffer_internal + 0x50;
    TemplatedValidityMask<unsigned_long>::RowIsValid
              ((TemplatedValidityMask<unsigned_long> *)in_RDI,row_idx);
    BitpackingState<unsigned_char,signed_char>::
    Update<duckdb::BitpackingCompressionState<unsigned_char,true,signed_char>::BitpackingWriter>
              (in_RDI,(uchar)(row_idx >> 0x38),SUB81(row_idx >> 0x30,0));
  }
  return;
}

Assistant:

void Append(UnifiedVectorFormat &vdata, idx_t count) {
		auto data = UnifiedVectorFormat::GetData<T>(vdata);

		for (idx_t i = 0; i < count; i++) {
			idx_t idx = vdata.sel->get_index(i);
			state.template Update<BitpackingCompressionState<T, WRITE_STATISTICS, T_S>::BitpackingWriter>(
			    data[idx], vdata.validity.RowIsValid(idx));
		}
	}